

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_malloc.c
# Opt level: O0

int bucket_of_size(size_t size)

{
  ulong in_RDI;
  int i;
  int local_c;
  
  local_c = 0;
  while( true ) {
    if (5 < local_c) {
      __cilkrts_bug("%s:%d: cilk assertion failed: %s\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/passlab[P]intel-cilk-runtime/runtime/frame_malloc.c"
                    ,0x170,"0");
    }
    if (in_RDI <= __cilkrts_bucket_sizes[local_c]) break;
    local_c = local_c + 1;
  }
  return local_c;
}

Assistant:

static int bucket_of_size(size_t size)
{
    int i;

    for (i = 0; i < FRAME_MALLOC_NBUCKETS; ++i)
        if (size <= FRAME_MALLOC_BUCKET_TO_SIZE(i))
            return i;

    CILK_ASSERT(0 /* can't happen */);
    return -1;
}